

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles2::Functional::eval_any_bvec4(ShaderEvalContext *c)

{
  uint uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  
  auVar3._4_4_ = -(uint)(0.0 < c->in[0].m_data[2]);
  auVar3._0_4_ = -(uint)(0.0 < c->in[0].m_data[1]);
  auVar3._8_4_ = -(uint)(0.0 < c->in[0].m_data[3]);
  auVar3._12_4_ = -(uint)(0.0 < c->in[0].m_data[0]);
  auVar3 = packssdw(auVar3,auVar3);
  auVar3 = packsswb(auVar3,auVar3);
  uVar1 = auVar3._0_4_ & (uint)DAT_01b89df0;
  fVar2 = 1.0;
  if (((((char)uVar1 == '\0') && ((uVar1 >> 8 & 1) == 0)) && ((uVar1 >> 0x10 & 1) == 0)) &&
     ((uVar1 >> 0x18 & 1) == 0)) {
    fVar2 = 0.0;
  }
  (c->color).m_data[0] = fVar2;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }